

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.cpp
# Opt level: O0

MatrixXd * __thiscall
Tools::CalculateJacobian(MatrixXd *__return_storage_ptr__,Tools *this,VectorXd *x_state)

{
  CoeffReturnType pdVar1;
  ostream *this_00;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar2;
  double dVar3;
  double local_160;
  double local_158;
  double local_150;
  double local_148;
  Scalar local_140;
  Scalar local_138;
  double local_130;
  double local_128;
  Scalar local_120;
  Scalar local_118;
  double local_110;
  double local_108;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_100;
  Scalar local_d8;
  Scalar local_d0;
  Scalar local_c8;
  Scalar local_c0;
  Scalar local_b8;
  Scalar local_b0;
  Scalar local_a8;
  Scalar local_a0;
  Scalar local_98;
  Scalar local_90;
  Scalar local_88;
  Scalar local_80;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_78;
  float local_54;
  float local_50;
  float c3;
  float c2;
  float c1;
  float vy;
  float vx;
  float py;
  float local_30;
  int local_2c;
  float px;
  undefined1 local_21;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *local_20;
  VectorXd *x_state_local;
  Tools *this_local;
  MatrixXd *Hj;
  
  local_21 = 0;
  px = 4.2039e-45;
  local_2c = 4;
  local_20 = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x_state;
  x_state_local = (VectorXd *)this;
  this_local = (Tools *)__return_storage_ptr__;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,(int *)&px,&local_2c);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()(local_20,0)
  ;
  local_30 = (float)*pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()(local_20,1)
  ;
  vy = (float)*pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()(local_20,2)
  ;
  c1 = (float)*pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()(local_20,3)
  ;
  c2 = (float)*pdVar1;
  c3 = local_30 * local_30 + vy * vy;
  dVar3 = std::sqrt((double)(ulong)(uint)c3);
  local_50 = SUB84(dVar3,0);
  local_54 = c3 * local_50;
  dVar3 = std::fabs((double)(ulong)(uint)c3);
  if (0.0001 <= SUB84(dVar3,0)) {
    local_108 = (double)(local_30 / local_50);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
              (&local_100,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)__return_storage_ptr__,
               &local_108);
    local_110 = (double)(vy / local_50);
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (&local_100,&local_110);
    local_118 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_118);
    local_120 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_120);
    local_128 = (double)-(vy / c3);
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_128);
    local_130 = (double)(local_30 / c3);
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_130);
    local_138 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_138);
    local_140 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_140);
    local_148 = (double)((vy * (c1 * vy - c2 * local_30)) / local_54);
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_148);
    local_150 = (double)((local_30 * (local_30 * c2 - vy * c1)) / local_54);
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_150);
    local_158 = (double)(local_30 / local_50);
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_158);
    local_160 = (double)(vy / local_50);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar2,&local_160)
    ;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer
              (&local_100);
  }
  else {
    this_00 = std::operator<<((ostream *)&std::cout,
                              "CalculateJacobian () - Error - Division by Zero - Returning zero matrix"
                             );
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    local_80 = 0.0;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
              (&local_78,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)__return_storage_ptr__,
               &local_80);
    local_88 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (&local_78,&local_88);
    local_90 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_90);
    local_98 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_98);
    local_a0 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_a0);
    local_a8 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_a8);
    local_b0 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_b0);
    local_b8 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_b8);
    local_c0 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_c0);
    local_c8 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_c8);
    local_d0 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_d0);
    local_d8 = 0.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar2,&local_d8);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_78)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

MatrixXd Tools::CalculateJacobian(const VectorXd& x_state) {
  /**
  TODO:
    * Calculate a Jacobian here.
  */

  MatrixXd Hj(3,4);

  //recover state parameters
  float px = x_state(0);
  float py = x_state(1);
  float vx = x_state(2);
  float vy = x_state(3);

  //pre-compute a set of terms to avoid repeated calculation
  float c1 = px*px+py*py;
  float c2 = sqrt(c1);
  float c3 = (c1*c2);

  //check division by zero
  if(fabs(c1) < 0.0001){
    cout << "CalculateJacobian () - Error - Division by Zero - Returning zero matrix" << endl;
    Hj << 0, 0, 0, 0,
          0, 0, 0, 0,
          0, 0, 0, 0;
    return Hj;
  }

  //compute the Jacobian matrix
  Hj << (px/c2), (py/c2), 0, 0,
       -(py/c1), (px/c1), 0, 0,
       py*(vx*py - vy*px)/c3, px*(px*vy - py*vx)/c3, px/c2, py/c2;

  return Hj;
}